

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O2

void Io_NtkWriteLatchNode(FILE *pFile,Abc_Obj_t *pLatch,int NodesOrPl)

{
  void **ppvVar1;
  long *plVar2;
  long *plVar3;
  Abc_Obj_t *pObj;
  char *pcVar4;
  char *pcVar5;
  
  ppvVar1 = pLatch->pNtk->vObjs->pArray;
  plVar2 = (long *)ppvVar1[*(pLatch->vFanins).pArray];
  plVar3 = (long *)ppvVar1[*(pLatch->vFanouts).pArray];
  pObj = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
  pcVar4 = Abc_ObjName(*(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8));
  pcVar5 = Abc_ObjName(pObj);
  fprintf((FILE *)pFile,"%s_%s_latch\t",pcVar4,pcVar5);
  if (NodesOrPl != 0) {
    return;
  }
  fprintf((FILE *)pFile," %d %d\n",6,1);
  return;
}

Assistant:

void Io_NtkWriteLatchNode( FILE * pFile, Abc_Obj_t * pLatch, int NodesOrPl )
{
    Abc_Obj_t * pNetLi, * pNetLo;
    
    pNetLi = Abc_ObjFanin0( Abc_ObjFanin0(pLatch) );
    pNetLo = Abc_ObjFanout0( Abc_ObjFanout0(pLatch) );
    /// write the latch line
    fprintf( pFile, "%s_%s_latch\t", Abc_ObjName(pNetLi), Abc_ObjName(pNetLo) );
    if (NodesOrPl == NODES)
        fprintf( pFile, " %d %d\n", 6, 1 );
}